

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV AsymVerifyFinal(Session *session,CK_BYTE_PTR pSignature,CK_ULONG ulSignatureLen)

{
  int iVar1;
  uint uVar2;
  AsymmetricAlgorithm *pAVar3;
  PublicKey *pPVar4;
  undefined4 extraout_var;
  long in_RDX;
  Session *in_RDI;
  ByteString signature;
  CK_ULONG size;
  PublicKey *publicKey;
  AsymmetricAlgorithm *asymCrypto;
  Session *in_stack_ffffffffffffff80;
  Session *this;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uchar *in_stack_ffffffffffffff98;
  ByteString *in_stack_ffffffffffffffa0;
  MacAlgorithm *local_8;
  
  pAVar3 = Session::getAsymmetricCryptoOp(in_RDI);
  pPVar4 = Session::getPublicKey(in_RDI);
  if ((pAVar3 == (AsymmetricAlgorithm *)0x0) || (pPVar4 == (PublicKey *)0x0)) {
    Session::resetOp(in_stack_ffffffffffffff80);
    local_8 = (MacAlgorithm *)0x91;
  }
  else {
    iVar1 = (*(pPVar4->super_Serialisable)._vptr_Serialisable[5])();
    if (in_RDX == CONCAT44(extraout_var,iVar1)) {
      this = (Session *)&stack0xffffffffffffffa0;
      ByteString::ByteString
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      uVar2 = (*pAVar3->_vptr_AsymmetricAlgorithm[9])(pAVar3,this);
      if ((uVar2 & 1) == 0) {
        Session::resetOp(this);
        local_8 = (MacAlgorithm *)0xc0;
      }
      else {
        Session::resetOp(this);
        local_8 = (MacAlgorithm *)0x0;
      }
      ByteString::~ByteString((ByteString *)0x17462e);
    }
    else {
      softHSMLog(3,"AsymVerifyFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x166f,"The size of the signature differs from the size of the mechanism");
      Session::resetOp(in_stack_ffffffffffffff80);
      local_8 = (MacAlgorithm *)0xc1;
    }
  }
  return (CK_RV)local_8;
}

Assistant:

static CK_RV AsymVerifyFinal(Session* session, CK_BYTE_PTR pSignature, CK_ULONG ulSignatureLen)
{
	AsymmetricAlgorithm* asymCrypto = session->getAsymmetricCryptoOp();
	PublicKey* publicKey = session->getPublicKey();
	if (asymCrypto == NULL || publicKey == NULL)
	{
		session->resetOp();
		return CKR_OPERATION_NOT_INITIALIZED;
	}

	// Size of the signature
	CK_ULONG size = publicKey->getOutputLength();

	// Check buffer size
	if (ulSignatureLen != size)
	{
		ERROR_MSG("The size of the signature differs from the size of the mechanism");
		session->resetOp();
		return CKR_SIGNATURE_LEN_RANGE;
	}

	// Get the data
	ByteString signature(pSignature, ulSignatureLen);

	// Verify the data
	if (!asymCrypto->verifyFinal(signature))
	{
		session->resetOp();
		return CKR_SIGNATURE_INVALID;
	}

	session->resetOp();
	return CKR_OK;
}